

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::ConsoleInterceptor::OnSetup(ConsoleInterceptor *this,SetupArgs *args)

{
  _Head_base<0UL,_perfetto::protos::gen::InterceptorConfig_*,_false> _Var1;
  int iVar2;
  int __fd;
  bool bVar3;
  Decoder config;
  TypedProtoDecoder<2,_false> TStack_698;
  
  __fd = (anonymous_namespace)::g_output_fd_for_testing +
         (uint)((anonymous_namespace)::g_output_fd_for_testing == 0);
  iVar2 = isatty(__fd);
  _Var1._M_head_impl =
       (args->config->interceptor_config_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::InterceptorConfig,_std::default_delete<perfetto::protos::gen::InterceptorConfig>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::InterceptorConfig_*,_std::default_delete<perfetto::protos::gen::InterceptorConfig>_>
       .super__Head_base<0UL,_perfetto::protos::gen::InterceptorConfig_*,_false>._M_head_impl;
  protozero::TypedProtoDecoder<2,_false>::TypedProtoDecoder
            (&TStack_698,*(uint8_t **)&((_Var1._M_head_impl)->console_config_)._M_dataplus,
             *(size_type *)((long)&(_Var1._M_head_impl)->console_config_ + 8));
  bVar3 = iVar2 != 0;
  if (TStack_698.super_TypedProtoDecoderBase.fields_[2].id_ != 0) {
    bVar3 = TStack_698.super_TypedProtoDecoderBase.fields_[2].int_value_ != 0;
  }
  iVar2 = (int)TStack_698.super_TypedProtoDecoderBase.fields_[1].int_value_;
  if (iVar2 == 2) {
    __fd = iVar2;
  }
  if (iVar2 == 1) {
    __fd = iVar2;
  }
  this->fd_ = __fd;
  this->use_colors_ = bVar3;
  if ((_Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>)
      TStack_698.super_TypedProtoDecoderBase.heap_storage_._M_t.
      super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>._M_t.
      super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>.
      super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl != (Field *)0x0) {
    operator_delete__((void *)TStack_698.super_TypedProtoDecoderBase.heap_storage_._M_t.
                              super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>
                              .super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void ConsoleInterceptor::OnSetup(const SetupArgs& args) {
  int fd = STDOUT_FILENO;
  if (g_output_fd_for_testing)
    fd = g_output_fd_for_testing;
#if !PERFETTO_BUILDFLAG(PERFETTO_OS_WIN) && \
    !PERFETTO_BUILDFLAG(PERFETTO_OS_WASM)
  bool use_colors = isatty(fd);
#else
  bool use_colors = false;
#endif
  protos::pbzero::ConsoleConfig::Decoder config(
      args.config.interceptor_config().console_config_raw());
  if (config.has_enable_colors())
    use_colors = config.enable_colors();
  if (config.output() == protos::pbzero::ConsoleConfig::OUTPUT_STDOUT) {
    fd = STDOUT_FILENO;
  } else if (config.output() == protos::pbzero::ConsoleConfig::OUTPUT_STDERR) {
    fd = STDERR_FILENO;
  }
  fd_ = fd;
  use_colors_ = use_colors;
}